

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

void * thread_specific_data(void *private_data)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  undefined4 uVar4;
  
  uVar1 = *private_data;
  iVar2 = xmlCheckThreadLocalStorage();
  if (iVar2 == 0) {
    uVar4 = 0;
    lVar3 = xmlReadFile(uVar1,0,6);
    if (lVar3 == 0) {
      puts("parse failed");
    }
    else {
      xmlFreeDoc(lVar3);
      uVar4 = 1;
    }
  }
  else {
    puts("xmlCheckThreadLocalStorage failed");
    uVar4 = 0;
  }
  *(undefined4 *)((long)private_data + 8) = uVar4;
  return (void *)0x0;
}

Assistant:

static void *
thread_specific_data(void *private_data)
{
    xmlDocPtr myDoc;
    xmlThreadParams *params = (xmlThreadParams *) private_data;
    const char *filename = params->filename;
    int okay = 1;

    if (xmlCheckThreadLocalStorage() != 0) {
        printf("xmlCheckThreadLocalStorage failed\n");
        params->okay = 0;
        return(NULL);
    }

#ifdef LIBXML_THREAD_ALLOC_ENABLED
    xmlMemSetup(xmlMemFree, xmlMemMalloc, xmlMemRealloc, xmlMemoryStrdup);
#endif

    myDoc = xmlReadFile(filename, NULL, XML_PARSE_NOENT | XML_PARSE_DTDLOAD);
    if (myDoc) {
        xmlFreeDoc(myDoc);
    } else {
        printf("parse failed\n");
        okay = 0;
    }
    params->okay = okay;
    return(NULL);
}